

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_Brep::ReadOld101(ON_Brep *this,ON_BinaryArchive *file)

{
  ON_BrepVertex *pOVar1;
  ON_BrepEdge *this_00;
  ON_Curve **ppOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *this_01;
  ON_Surface **ppOVar5;
  ON_Surface *local_a0;
  ON_Curve *local_90;
  ON_Curve *local_80;
  ON_BrepFace *face;
  ON_BrepTrim *trim;
  ON_BrepEdge *edge;
  int count;
  int i;
  ON_Surface *pS;
  ON_Curve *pC;
  ON_Object *pO;
  ON_BinaryArchive *file_local;
  ON_Brep *this_local;
  
  pC = (ON_Curve *)0x0;
  pS = (ON_Surface *)0x0;
  _count = (ON_Surface *)0x0;
  pO = (ON_Object *)file;
  file_local = (ON_BinaryArchive *)this;
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&edge);
  ON_SimpleArray<ON_Curve_*>::Reserve
            (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pC = (ON_Curve *)0x0;
    ON_BinaryArchive::ReadObject((ON_BinaryArchive *)pO,(ON_Object **)&pC);
    pS = (ON_Surface *)ON_Curve::Cast((ON_Object *)pC);
    if ((pS == (ON_Surface *)0x0) && (pC != (ON_Curve *)0x0)) {
      (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&pS);
    pS = (ON_Surface *)0x0;
    pC = (ON_Curve *)0x0;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_SimpleArray<ON_Curve_*>::Reserve
            (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pC = (ON_Curve *)0x0;
    ON_BinaryArchive::ReadObject((ON_BinaryArchive *)pO,(ON_Object **)&pC);
    pS = (ON_Surface *)ON_Curve::Cast((ON_Object *)pC);
    if ((pS == (ON_Surface *)0x0) && (pC != (ON_Curve *)0x0)) {
      (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&pS);
    pS = (ON_Surface *)0x0;
    pC = (ON_Curve *)0x0;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_SimpleArray<ON_Surface_*>::Reserve
            (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,(long)(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pC = (ON_Curve *)0x0;
    ON_BinaryArchive::ReadObject((ON_BinaryArchive *)pO,(ON_Object **)&pC);
    _count = ON_Surface::Cast((ON_Object *)pC);
    if ((_count == (ON_Surface *)0x0) && (pC != (ON_Curve *)0x0)) {
      (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    ON_SimpleArray<ON_Surface_*>::Append
              (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,(ON_Surface **)&count);
    _count = (ON_Surface *)0x0;
    pC = (ON_Curve *)0x0;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&this->m_V,(long)(int)edge);
  ON_ClassArray<ON_BrepVertex>::SetCount((ON_ClassArray<ON_BrepVertex> *)&this->m_V,(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pOVar1 = ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,edge._4_4_);
    (*(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0xb])(pOVar1,pO);
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&this->m_E,(long)(int)edge);
  ON_ClassArray<ON_BrepEdge>::SetCount((ON_ClassArray<ON_BrepEdge> *)&this->m_E,(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    this_00 = ON_ClassArray<ON_BrepEdge>::operator[]
                        ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,edge._4_4_);
    (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0xb])(this_00,pO);
    if (this_00->m_c3i < 0) {
      local_80 = (ON_Curve *)0x0;
    }
    else {
      ppOVar2 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,this_00->m_c3i);
      local_80 = *ppOVar2;
    }
    ON_CurveProxy::SetProxyCurve(&this_00->super_ON_CurveProxy,local_80);
    this_00->m_brep = this;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&this->m_T,(long)(int)edge);
  ON_ClassArray<ON_BrepTrim>::SetCount((ON_ClassArray<ON_BrepTrim> *)&this->m_T,(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,edge._4_4_);
    (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0xb])(pOVar3,pO);
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,edge._4_4_);
    if (pOVar3->m_c2i < 0) {
      local_90 = (ON_Curve *)0x0;
    }
    else {
      ppOVar2 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,pOVar3->m_c2i);
      local_90 = *ppOVar2;
    }
    ON_CurveProxy::SetProxyCurve(&pOVar3->super_ON_CurveProxy,local_90);
    pOVar3->m_brep = this;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&this->m_L,(long)(int)edge);
  ON_ClassArray<ON_BrepLoop>::SetCount((ON_ClassArray<ON_BrepLoop> *)&this->m_L,(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,edge._4_4_);
    (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xb])(pOVar4,pO);
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,edge._4_4_);
    pOVar4->m_brep = this;
  }
  ON_BinaryArchive::ReadInt((ON_BinaryArchive *)pO,(ON__INT32 *)&edge);
  ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&this->m_F,(long)(int)edge);
  ON_ClassArray<ON_BrepFace>::SetCount((ON_ClassArray<ON_BrepFace> *)&this->m_F,(int)edge);
  for (edge._4_4_ = 0; edge._4_4_ < (int)edge; edge._4_4_ = edge._4_4_ + 1) {
    this_01 = ON_ClassArray<ON_BrepFace>::operator[]
                        ((ON_ClassArray<ON_BrepFace> *)&this->m_F,edge._4_4_);
    (*(this_01->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0xb])(this_01,pO);
    if (this_01->m_si < 0) {
      local_a0 = (ON_Surface *)0x0;
    }
    else {
      ppOVar5 = ON_SimpleArray<ON_Surface_*>::operator[]
                          (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,this_01->m_si);
      local_a0 = *ppOVar5;
    }
    ON_SurfaceProxy::SetProxySurface(&this_01->super_ON_SurfaceProxy,local_a0);
    this_01->m_brep = this;
  }
  ON_BinaryArchive::ReadPoint((ON_BinaryArchive *)pO,&(this->m_bbox).m_min);
  ON_BinaryArchive::ReadPoint((ON_BinaryArchive *)pO,&(this->m_bbox).m_max);
  ReadFillInMissingBoxes(this);
  return true;
}

Assistant:

bool ON_Brep::ReadOld101( ON_BinaryArchive& file )
{
  ON_Object*  pO = nullptr;
  ON_Curve*   pC = nullptr;
  ON_Surface* pS = nullptr;
  int i, count;

  // 2d curves
  file.ReadInt( &count );
  m_C2.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C2.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // 3d curves
  file.ReadInt( &count );
  m_C3.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C3.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // untrimmed surfaces
  file.ReadInt( &count );
  m_S.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pS = ON_Surface::Cast(pO);
    if ( !pS )
      delete pO; // ERROR!
    m_S.Append( pS );
    pS = nullptr;
    pO = nullptr;
  }

  // vertices
  file.ReadInt( &count );
  m_V.Reserve(count);
  m_V.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_V[i].Read(file);
  }

  // edges
  file.ReadInt( &count );
  m_E.Reserve(count);
  m_E.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepEdge& edge = m_E[i];
    edge.Read(file);
    edge.SetProxyCurve( edge.m_c3i >= 0 ? m_C3[edge.m_c3i] : 0 );
    edge.m_brep = this;
  }

  // trims
  file.ReadInt( &count );
  m_T.Reserve(count);
  m_T.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_T[i].Read(file);
    ON_BrepTrim& trim = m_T[i];
    trim.SetProxyCurve( trim.m_c2i >= 0 ? m_C2[trim.m_c2i] : 0 );
    trim.m_brep = this;
  }

  // loops
  file.ReadInt( &count );
  m_L.Reserve(count);
  m_L.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_L[i].Read(file);
    m_L[i].m_brep = this;
  }

  // faces
  file.ReadInt( &count );
  m_F.Reserve(count);
  m_F.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.Read(file);
    face.SetProxySurface(face.m_si >= 0 ? m_S[face.m_si] : 0);
    face.m_brep = this;
  }

  // bounding box
  file.ReadPoint( m_bbox.m_min );
  file.ReadPoint( m_bbox.m_max );

  // fill in missing information
  ReadFillInMissingBoxes(*this);

  return true;
}